

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Size ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,": ");
  for (uVar2 = 0; uVar2 < this->mSize; uVar2 = uVar2 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,this->mData[(this->mFront + uVar2) % this->mCap]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      for (size_t i = 0;i < mSize;i++) {
        std::cout << mData[(mFront+i) % mCap] << " ";
      }
      std::cout << std::endl;
    }